

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O0

bool __thiscall
Scine::Core::ModuleManager::Impl::has(Impl *this,string *interface,string *model,string *moduleName)

{
  undefined1 uVar1;
  bool bVar2;
  ulong uVar3;
  element_type *peVar4;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined8 in_RDX;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<Scine::Core::Module> *modulePtr_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  ModuleList *__range3_1;
  LibraryAndModules *source_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  *__range2;
  string modulePtrLower;
  shared_ptr<Scine::Core::Module> *modulePtr;
  const_iterator __end4;
  const_iterator __begin4;
  ModuleList *__range4;
  LibraryAndModules *source;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  *__range3;
  string moduleNameLower;
  int in_stack_fffffffffffffe78;
  undefined2 in_stack_fffffffffffffe7c;
  byte in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  undefined1 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  local_140;
  ModuleList *local_138;
  reference local_130;
  LibraryAndModules *local_128;
  __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
  local_120 [2];
  int local_110;
  byte local_109;
  string local_108 [32];
  locale local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  reference local_a0;
  shared_ptr<Scine::Core::Module> *local_98;
  __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  local_90;
  ModuleList *local_88;
  reference local_80;
  LibraryAndModules *local_78;
  __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
  local_70 [4];
  undefined1 local_50 [48];
  undefined8 local_20;
  undefined8 local_18;
  byte local_1;
  
  __rhs = (char *)CONCAT71(in_register_00000009,in_CL);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::locale::locale((locale *)__lhs);
  boost::algorithm::to_lower_copy<std::__cxx11::string>
            (in_RDI,(locale *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::locale::~locale((locale *)local_50);
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (uVar1 = std::operator!=(in_stack_fffffffffffffe80,
                              (char *)CONCAT17(in_stack_fffffffffffffe7f,
                                               CONCAT16(in_stack_fffffffffffffe7e,
                                                        CONCAT24(in_stack_fffffffffffffe7c,
                                                                 in_stack_fffffffffffffe78)))),
     (bool)uVar1)) {
    local_70[0]._M_current =
         (LibraryAndModules *)
         std::
         vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
         ::begin((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                  *)CONCAT17(in_stack_fffffffffffffe7f,
                             CONCAT16(in_stack_fffffffffffffe7e,
                                      CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
                            ));
    local_78 = (LibraryAndModules *)
               std::
               vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
               ::end((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                      *)CONCAT17(in_stack_fffffffffffffe7f,
                                 CONCAT16(in_stack_fffffffffffffe7e,
                                          CONCAT24(in_stack_fffffffffffffe7c,
                                                   in_stack_fffffffffffffe78))));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)in_stack_fffffffffffffe80,
                              (__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe7f,
                                          CONCAT16(in_stack_fffffffffffffe7e,
                                                   CONCAT24(in_stack_fffffffffffffe7c,
                                                            in_stack_fffffffffffffe78)))), bVar2) {
      local_80 = __gnu_cxx::
                 __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                 ::operator*(local_70);
      local_88 = &local_80->modules;
      local_90._M_current =
           (shared_ptr<Scine::Core::Module> *)
           std::
           vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
           ::begin((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe7f,
                               CONCAT16(in_stack_fffffffffffffe7e,
                                        CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78
                                                ))));
      local_98 = (shared_ptr<Scine::Core::Module> *)
                 std::
                 vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                 ::end((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe7f,
                                   CONCAT16(in_stack_fffffffffffffe7e,
                                            CONCAT24(in_stack_fffffffffffffe7c,
                                                     in_stack_fffffffffffffe78))));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)in_stack_fffffffffffffe80,
                                (__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffe7f,
                                            CONCAT16(in_stack_fffffffffffffe7e,
                                                     CONCAT24(in_stack_fffffffffffffe7c,
                                                              in_stack_fffffffffffffe78)))), bVar2)
      {
        local_a0 = __gnu_cxx::
                   __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                   ::operator*(&local_90);
        peVar4 = std::
                 __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x12901d);
        in_stack_fffffffffffffe80 = &local_e0;
        (**(code **)(*(long *)peVar4 + 0x10))();
        std::locale::locale(local_e8);
        boost::algorithm::to_lower_copy<std::__cxx11::string>
                  (in_RDI,(locale *)CONCAT17(uVar1,in_stack_fffffffffffffe90));
        std::locale::~locale(local_e8);
        std::__cxx11::string::~string((string *)&local_e0);
        bVar2 = std::operator!=(in_stack_fffffffffffffe80,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffe7f,
                                          CONCAT16(in_stack_fffffffffffffe7e,
                                                   CONCAT24(in_stack_fffffffffffffe7c,
                                                            in_stack_fffffffffffffe78))));
        local_109 = 0;
        uVar5 = false;
        if (bVar2) {
          std::operator+(__lhs,__rhs);
          local_109 = 1;
          uVar5 = std::operator!=(in_stack_fffffffffffffe80,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffe7e,
                                                             CONCAT24(in_stack_fffffffffffffe7c,
                                                                      in_stack_fffffffffffffe78))));
        }
        in_stack_fffffffffffffe7e = uVar5;
        in_stack_fffffffffffffe7f = in_stack_fffffffffffffe7e;
        if ((local_109 & 1) != 0) {
          std::__cxx11::string::~string(local_108);
        }
        if ((in_stack_fffffffffffffe7e & 1) == 0) {
          peVar4 = std::
                   __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1291bd);
          uVar3 = (**(code **)(*(long *)peVar4 + 0x20))(peVar4,local_18,local_20);
          if ((uVar3 & 1) == 0) {
            local_110 = 0;
          }
          else {
            local_1 = 1;
            local_110 = 1;
          }
        }
        else {
          local_110 = 5;
        }
        std::__cxx11::string::~string(local_c0);
        if ((local_110 != 0) && (local_110 != 5)) goto LAB_00129363;
        in_stack_fffffffffffffe78 = local_110;
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
        ::operator++(&local_90);
      }
      __gnu_cxx::
      __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
      ::operator++(local_70);
    }
    local_1 = 0;
    local_110 = 1;
  }
  else {
    local_120[0]._M_current =
         (LibraryAndModules *)
         std::
         vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
         ::begin((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                  *)CONCAT17(in_stack_fffffffffffffe7f,
                             CONCAT16(in_stack_fffffffffffffe7e,
                                      CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
                            ));
    local_128 = (LibraryAndModules *)
                std::
                vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                ::end((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                       *)CONCAT17(in_stack_fffffffffffffe7f,
                                  CONCAT16(in_stack_fffffffffffffe7e,
                                           CONCAT24(in_stack_fffffffffffffe7c,
                                                    in_stack_fffffffffffffe78))));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)in_stack_fffffffffffffe80,
                              (__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe7f,
                                          CONCAT16(in_stack_fffffffffffffe7e,
                                                   CONCAT24(in_stack_fffffffffffffe7c,
                                                            in_stack_fffffffffffffe78)))), bVar2) {
      local_130 = __gnu_cxx::
                  __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                  ::operator*(local_120);
      local_138 = &local_130->modules;
      local_140._M_current =
           (shared_ptr<Scine::Core::Module> *)
           std::
           vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
           ::begin((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe7f,
                               CONCAT16(in_stack_fffffffffffffe7e,
                                        CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78
                                                ))));
      std::
      vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
      ::end((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
             *)CONCAT17(in_stack_fffffffffffffe7f,
                        CONCAT16(in_stack_fffffffffffffe7e,
                                 CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)in_stack_fffffffffffffe80,
                                (__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffe7f,
                                            CONCAT16(in_stack_fffffffffffffe7e,
                                                     CONCAT24(in_stack_fffffffffffffe7c,
                                                              in_stack_fffffffffffffe78)))), bVar2)
      {
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
        ::operator*(&local_140);
        peVar4 = std::
                 __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x129303);
        uVar3 = (**(code **)(*(long *)peVar4 + 0x20))(peVar4,local_18,local_20);
        if ((uVar3 & 1) != 0) {
          local_1 = 1;
          local_110 = 1;
          goto LAB_00129363;
        }
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
        ::operator++(&local_140);
      }
      __gnu_cxx::
      __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
      ::operator++(local_120);
    }
    local_1 = 0;
    local_110 = 1;
  }
LAB_00129363:
  std::__cxx11::string::~string((string *)(local_50 + 8));
  return (bool)(local_1 & 1);
}

Assistant:

bool has(const std::string& interface, const std::string& model, const std::string& moduleName) const {
    // If the module name is specified, look in detailed fashion
    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          if (modulePtr->has(interface, model)) {
            return true;
          }
        }
      }
      return false;
    }

    for (const auto& source : _sources) {
      for (const auto& modulePtr : source.modules) {
        if (modulePtr->has(interface, model)) {
          return true;
        }
      }
    }

    return false;
  }